

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O3

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::~AESStateMBEDTLS(AESStateMBEDTLS *this)

{
  _Head_base<0UL,_mbedtls_cipher_context_t_*,_false> _Var1;
  
  (this->super_EncryptionState)._vptr_EncryptionState = (_func_int **)&PTR__AESStateMBEDTLS_02471e70
  ;
  _Var1._M_head_impl =
       (this->context).
       super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>.
       _M_t.
       super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
       .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (mbedtls_cipher_context_t *)0x0) {
    mbedtls_cipher_free(_Var1._M_head_impl);
    _Var1._M_head_impl =
         (this->context).
         super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>.
         _M_t.
         super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
         ._M_t.
         super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
         .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (mbedtls_cipher_context_t *)0x0) {
      operator_delete(_Var1._M_head_impl);
    }
  }
  (this->context).
  super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>._M_t.
  super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>.
  _M_t.
  super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
  .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl =
       (mbedtls_cipher_context_t *)0x0;
  duckdb::EncryptionState::~EncryptionState(&this->super_EncryptionState);
  return;
}

Assistant:

MbedTlsWrapper::AESStateMBEDTLS::~AESStateMBEDTLS() {
	if (context) {
		mbedtls_cipher_free(context.get());
	}
}